

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O1

pdu_aspa *
append_aspa(uint8_t version,uint8_t flags,uint32_t customer_asn,uint32_t *provider_asns,
           size_t provider_count)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  char *pcVar7;
  undefined4 in_register_00000014;
  void *__src;
  undefined7 in_register_00000031;
  uint32_t *puVar8;
  long in_FS_OFFSET;
  
  __src = (void *)CONCAT44(in_register_00000014,customer_asn);
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (long)provider_asns * 4 + 0x10;
  pcVar7 = (char *)lrtr_realloc(data,data_size + lVar2);
  sVar4 = data_size;
  data = pcVar7;
  if (pcVar7 == (char *)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x8c,
                  "struct pdu_aspa *append_aspa(uint8_t, uint8_t, uint32_t, uint32_t *, size_t)");
  }
  pcVar1 = pcVar7 + data_size;
  pcVar1[0] = '\x02';
  pcVar1[1] = '\v';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  uVar6 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,(uint32_t)lVar2);
  *(uint32_t *)(pcVar7 + sVar4 + 4) = uVar6;
  pcVar7[sVar4 + 8] = version;
  pcVar7[sVar4 + 9] = '\x03';
  uVar5 = lrtr_convert_short(TO_HOST_HOST_BYTE_ORDER,(uint16_t)provider_asns);
  *(uint16_t *)(pcVar7 + sVar4 + 10) = uVar5;
  uVar6 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,(uint32_t)CONCAT71(in_register_00000031,flags));
  *(uint32_t *)(pcVar7 + sVar4 + 0xc) = uVar6;
  if (provider_asns != (uint32_t *)0x0) {
    puVar8 = (uint32_t *)0x0;
    do {
      uVar6 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,
                                *(uint32_t *)((long)__src + (long)puVar8 * 4));
      *(uint32_t *)((long)__src + (long)puVar8 * 4) = uVar6;
      puVar8 = (uint32_t *)((long)puVar8 + 1);
    } while (provider_asns != puVar8);
  }
  if (__src != (void *)0x0) {
    memcpy((pdu_aspa *)(pcVar7 + sVar4) + 1,__src,(long)provider_asns << 2);
  }
  data_size = data_size + lVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (pdu_aspa *)(pcVar7 + sVar4);
  }
  __stack_chk_fail();
}

Assistant:

static struct pdu_aspa *append_aspa(uint8_t version, uint8_t flags, uint32_t customer_asn, uint32_t provider_asns[],
				    size_t provider_count)
{
	size_t pdu_size = sizeof(struct pdu_aspa) + sizeof(uint32_t) * provider_count;

	data = lrtr_realloc(data, data_size + pdu_size);
	assert(data);

	struct pdu_aspa *aspa = (struct pdu_aspa *)(data + data_size);

	aspa->ver = version;
	aspa->type = ASPA;
	aspa->zero = 0;
	aspa->len = BYTES32(pdu_size);
	aspa->flags = flags;
	aspa->afi_flags = 0x3;
	aspa->provider_count = BYTES16((uint16_t)provider_count);
	aspa->customer_asn = BYTES32(customer_asn);

	for (size_t i = 0; i < provider_count; i++)
		provider_asns[i] = BYTES32(provider_asns[i]);

	if (provider_asns)
		memcpy(aspa->provider_asns, provider_asns, sizeof(uint32_t) * provider_count);

	data_size += pdu_size;

	return aspa;
}